

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
determineIfBoundaryNodes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ImportedUgrid *ugrid)

{
  pointer piVar1;
  pointer piVar2;
  uint in_EAX;
  long lVar3;
  pointer piVar4;
  long lVar5;
  int i_1;
  int t;
  ulong uVar6;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(int)((ulong)((long)(ugrid->nodes).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(ugrid->nodes).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 3) / 3),
             (value_type_conflict2 *)((long)&uStack_28 + 4),(allocator_type *)((long)&uStack_28 + 3)
            );
  piVar4 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar6 != (ulong)(lVar3 >> 2) / 3; uVar6 = uVar6 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      piVar1[piVar4[lVar5]] = 1;
    }
    piVar4 = piVar4 + 3;
  }
  piVar4 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar6 != (ulong)((long)piVar1 - (long)piVar4 >> 2) >> 2; uVar6 = uVar6 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      piVar2[piVar4[(ulong)((uint)uVar6 & 0x3fffffff) * 4 + lVar3]] = 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> determineIfBoundaryNodes(const Parfait::ImportedUgrid& ugrid){
    int nnodes = ugrid.nodes.size()/3;
    std::vector<int> is_boundary(nnodes, 0);
    for(int t = 0; t < ugrid.triangles.size() /3; t++){
        for(int i = 0; i < 3; i++){
            int n = ugrid.triangles[3*t+i];
            is_boundary[n] = 1;
        }
    }
    for(int q = 0; q < ugrid.quads.size() /4; q++){
        for(int i = 0; i < 4; i++){
            int n = ugrid.quads[4*q+i];
            is_boundary[n] = 1;
        }
    }
    return is_boundary;
}